

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void __thiscall google::protobuf::internal::Mutex::Lock(Mutex *this)

{
  int __errnum;
  undefined1 local_50 [24];
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  __errnum = pthread_mutex_lock((pthread_mutex_t *)this->mInternal);
  if (__errnum != 0) {
    local_50._0_4_ = LOGLEVEL_DFATAL;
    local_50._8_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/stubs/common.cc"
    ;
    local_50._16_4_ = 0x130;
    local_38._M_p = (pointer)&local_28;
    local_30 = 0;
    local_28._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)&local_38);
    strerror(__errnum);
    std::__cxx11::string::append((char *)&local_38);
    LogMessage::Finish((LogMessage *)local_50);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void Mutex::Lock() {
  int result = pthread_mutex_lock(&mInternal->mutex);
  if (result != 0) {
    GOOGLE_LOG(FATAL) << "pthread_mutex_lock: " << strerror(result);
  }
}